

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O0

Action __thiscall
psy::C::TypeCanonicalizer::visitTranslationUnit(TypeCanonicalizer *this,TranslationUnitSyntax *node)

{
  Action AVar1;
  CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
  *it;
  TranslationUnitSymbol *local_28;
  TranslationUnitSyntax *local_20;
  TranslationUnitSyntax *node_local;
  TypeCanonicalizer *this_local;
  
  local_20 = node;
  node_local = (TranslationUnitSyntax *)this;
  local_28 = SemanticModel::translationUnit(this->semaModel_);
  std::
  stack<const_psy::C::Symbol_*,_std::deque<const_psy::C::Symbol_*,_std::allocator<const_psy::C::Symbol_*>_>_>
  ::push(&this->syms_,(value_type *)&local_28);
  it = &TranslationUnitSyntax::declarations(local_20)->
        super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
  ;
  AVar1 = SyntaxVisitor::
          visit<psy::C::DeclarationSyntax*,psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>>
                    (&this->super_SyntaxVisitor,it);
  if (AVar1 == Quit) {
    this_local._7_1_ = Quit;
  }
  else {
    std::
    stack<const_psy::C::Symbol_*,_std::deque<const_psy::C::Symbol_*,_std::allocator<const_psy::C::Symbol_*>_>_>
    ::pop(&this->syms_);
    this_local._7_1_ = Skip;
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action TypeCanonicalizer::visitTranslationUnit(const TranslationUnitSyntax* node)
{
    syms_.push(semaModel_->translationUnit());
    VISIT(node->declarations());
    syms_.pop();

    return Action::Skip;
}